

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroup::TemplatedScan<(duckdb::TableScanType)2>
          (RowGroup *this,TransactionData transaction,CollectionScanState *state,DataChunk *result)

{
  undefined8 uVar1;
  double dVar2;
  _Bit_pointer puVar3;
  bool bVar4;
  FilterPropagateResult FVar5;
  uint uVar6;
  ScanSamplingInfo *pSVar7;
  _Bit_pointer puVar8;
  pointer pSVar9;
  vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_> *this_00;
  size_type sVar10;
  const_reference this_01;
  ScanFilterInfo *pSVar11;
  reference pvVar12;
  long *plVar13;
  idx_t iVar14;
  ColumnData *pCVar15;
  type pCVar16;
  reference this_02;
  TableFilter *pTVar17;
  const_reference this_03;
  long lVar18;
  DataChunk *in_RDX;
  long in_RSI;
  long *in_RDI;
  ScanFilterInfo *in_stack_00000008;
  undefined8 in_stack_00000010;
  ScanFilterInfo *in_stack_00000018;
  idx_t in_stack_000000d0;
  TableFilterState *in_stack_000000d8;
  TableFilter *in_stack_000000e0;
  UnifiedVectorFormat *in_stack_000000e8;
  Vector *in_stack_000000f0;
  SelectionVector *in_stack_000000f8;
  idx_t *in_stack_00000110;
  ColumnData *col_data_3;
  size_t sel_idx_1;
  long *result_data_1;
  value_type *column_2;
  idx_t i_4;
  ColumnData *col_data_2;
  value_type *col_idx;
  idx_t i_3;
  ScanFilter *table_filter;
  const_iterator __end5;
  const_iterator __begin5;
  vector<duckdb::ScanFilter,_true> *__range5;
  ColumnData *col_data_1;
  UnifiedVectorFormat vdata;
  size_t sel_idx;
  long *result_data;
  FilterPropagateResult prune_result;
  unsigned_long rowid_end;
  idx_t rowid_start;
  value_type *result_vector;
  idx_t column_idx;
  idx_t scan_idx;
  TableFilterState *table_filter_state;
  value_type *filter;
  value_type filter_idx;
  idx_t i_2;
  vector<duckdb::ScanFilter,_true> *filter_list;
  AdaptiveFilterState filter_state;
  optional_ptr<duckdb::AdaptiveFilter,_true> adaptive_filter;
  SelectionVector sel;
  idx_t approved_tuple_count;
  ColumnData *col_data;
  value_type *column_1;
  idx_t i_1;
  bool has_filters;
  BufferManager *buffer_manager;
  value_type *column;
  idx_t i;
  PrefetchState prefetch_state;
  BlockManager *block_manager;
  idx_t count;
  unsigned_long max_count;
  idx_t current_row;
  ScanFilterInfo *filter_info;
  vector<duckdb::StorageIndex,_true> *column_ids;
  bool ALLOW_UPDATES;
  ScanFilterInfo *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  ScanFilterInfo *in_stack_fffffffffffffc58;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffc60;
  ScanFilterInfo *in_stack_fffffffffffffc68;
  ColumnData *in_stack_fffffffffffffc70;
  CollectionScanState *in_stack_fffffffffffffc78;
  RowGroup *in_stack_fffffffffffffc80;
  reference in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  RowGroup *in_stack_fffffffffffffce8;
  TableFilter *in_stack_fffffffffffffcf0;
  ColumnData *in_stack_fffffffffffffd10;
  idx_t in_stack_fffffffffffffd18;
  Vector *in_stack_fffffffffffffd20;
  TableFilterSet *local_218;
  ulong local_200;
  TableFilter *local_1e0;
  __normal_iterator<const_duckdb::ScanFilter_*,_std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>_>
  local_1c8;
  vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_> *local_1c0;
  ScanFilterInfo *local_1b8;
  undefined8 uStack_1b0;
  ScanFilterInfo *local_1a8;
  idx_t in_stack_fffffffffffffe60;
  ColumnData *in_stack_fffffffffffffe68;
  Vector *in_stack_fffffffffffffe70;
  storage_t in_stack_fffffffffffffe90;
  RowGroup *in_stack_fffffffffffffe98;
  TableFilterSet *local_148;
  ulong local_f0;
  SelectionVector local_d0;
  undefined1 local_b8 [72];
  _Bit_pointer local_70;
  undefined1 local_68 [24];
  BlockManager *local_50;
  TableFilterSet *local_48;
  TableFilterSet *local_40;
  long local_38;
  ScanFilterInfo *local_30;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *local_28;
  undefined1 local_19;
  DataChunk *local_18;
  long local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = &CollectionScanState::GetColumnIds((CollectionScanState *)0xbe48a4)->
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>;
  local_30 = CollectionScanState::GetFilterInfo((CollectionScanState *)0xbe48b9);
LAB_00be48c1:
  do {
    do {
      if (*(ulong *)(local_10 + 0x10) <= (ulong)(*(long *)(local_10 + 8) << 0xb)) {
        return;
      }
      local_38 = *(long *)(local_10 + 8) * 0x800;
      local_40 = (TableFilterSet *)
                 MinValue<unsigned_long>
                           (0x800,*(long *)(local_10 + 0x10) + *(long *)(local_10 + 8) * -0x800);
      pSVar7 = CollectionScanState::GetSamplingInfo((CollectionScanState *)0xbe492f);
      if ((pSVar7->do_system_sample & 1U) != 0) {
        dVar2 = RandomEngine::NextRandom
                          ((RandomEngine *)
                           CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        pSVar7 = CollectionScanState::GetSamplingInfo((CollectionScanState *)0xbe495b);
        if (pSVar7->sample_rate <= dVar2 && dVar2 != pSVar7->sample_rate) {
          NextVector(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          goto LAB_00be48c1;
        }
      }
      bVar4 = CheckZonemapSegments
                        (in_stack_fffffffffffffce8,
                         (CollectionScanState *)
                         CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    } while (!bVar4);
    local_48 = local_40;
    local_50 = GetBlockManager((RowGroup *)0xbe49c0);
    uVar6 = (*local_50->_vptr_BlockManager[0x12])();
    if ((uVar6 & 1) != 0) {
      PrefetchState::PrefetchState((PrefetchState *)0xbe49ef);
      for (local_70 = (_Bit_pointer)0x0; puVar3 = local_70,
          puVar8 = (_Bit_pointer)
                   ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::size
                             (local_28), puVar3 < puVar8;
          local_70 = (_Bit_pointer)((long)local_70 + 1)) {
        local_b8._64_8_ =
             vector<duckdb::StorageIndex,_true>::operator[]
                       ((vector<duckdb::StorageIndex,_true> *)
                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                        (size_type)in_stack_fffffffffffffc48);
        bVar4 = StorageIndex::IsRowIdColumn((StorageIndex *)local_b8._64_8_);
        if (!bVar4) {
          pCVar15 = GetColumn((RowGroup *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                              (StorageIndex *)in_stack_fffffffffffffc48);
          pCVar16 = unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
                    ::operator[]((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
                                  *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                 (size_t)in_stack_fffffffffffffc48);
          (*pCVar15->_vptr_ColumnData[6])(pCVar15,local_68,pCVar16,local_40);
        }
      }
      local_b8._40_8_ = local_50->buffer_manager;
      (*((BufferManager *)local_b8._40_8_)->_vptr_BufferManager[8])(local_b8._40_8_,local_68);
      PrefetchState::~PrefetchState((PrefetchState *)0xbe4b4d);
    }
    local_b8[0x27] = ScanFilterInfo::HasFilters(in_stack_fffffffffffffc58);
    if ((local_48 == local_40) && (!(bool)local_b8[0x27])) {
      for (local_b8._24_8_ = (pointer)0x0; uVar1 = local_b8._24_8_,
          pSVar9 = (pointer)::std::
                            vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::
                            size(local_28), (ulong)uVar1 < pSVar9;
          local_b8._24_8_ = (long)(idx_t *)local_b8._24_8_ + 1) {
        local_b8._16_8_ =
             vector<duckdb::StorageIndex,_true>::operator[]
                       ((vector<duckdb::StorageIndex,_true> *)
                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                        (size_type)in_stack_fffffffffffffc48);
        bVar4 = StorageIndex::IsRowIdColumn((StorageIndex *)local_b8._16_8_);
        if (bVar4) {
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (size_type)in_stack_fffffffffffffc48);
          UnsafeNumericCast<long,unsigned_long,void>(*in_RDI + local_38);
          Vector::Sequence((Vector *)in_stack_fffffffffffffc80,(int64_t)in_stack_fffffffffffffc78,
                           (int64_t)in_stack_fffffffffffffc70,(idx_t)in_stack_fffffffffffffc68);
        }
        else {
          local_b8._8_8_ =
               GetColumn((RowGroup *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (StorageIndex *)in_stack_fffffffffffffc48);
          unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
          ::operator[]((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
                        *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                       (size_t)in_stack_fffffffffffffc48);
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (size_type)in_stack_fffffffffffffc48);
          ColumnData::ScanCommitted
                    (in_stack_fffffffffffffc70,(idx_t)in_stack_fffffffffffffc68,
                     (ColumnScanState *)in_stack_fffffffffffffc60.__d.__r,
                     (Vector *)in_stack_fffffffffffffc58,
                     SUB41((uint)in_stack_fffffffffffffc54 >> 0x18,0));
        }
      }
LAB_00be57f2:
      DataChunk::SetCardinality(local_18,(idx_t)local_48);
      *(long *)(local_10 + 8) = *(long *)(local_10 + 8) + 1;
      return;
    }
    local_b8._0_8_ = local_48;
    SelectionVector::SelectionVector((SelectionVector *)0xbe4d25);
    if (local_48 == local_40) {
      SelectionVector::Initialize
                ((SelectionVector *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (sel_t *)in_stack_fffffffffffffc48);
    }
    else {
      SelectionVector::Initialize
                ((SelectionVector *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (SelectionVector *)in_stack_fffffffffffffc48);
    }
    ScanFilterInfo::GetAdaptiveFilter(in_stack_fffffffffffffc48);
    ScanFilterInfo::BeginFilter(in_stack_fffffffffffffc48);
    if ((local_b8[0x27] & 1) != 0) {
      this_00 = &ScanFilterInfo::GetFilterList(local_30)->
                 super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>;
      for (local_f0 = 0;
          sVar10 = ::std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>::size
                             (this_00), local_f0 < sVar10; local_f0 = local_f0 + 1) {
        optional_ptr<duckdb::AdaptiveFilter,_true>::operator->
                  ((optional_ptr<duckdb::AdaptiveFilter,_true> *)
                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        vector<unsigned_long,_true>::operator[]
                  ((vector<unsigned_long,_true> *)
                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (size_type)in_stack_fffffffffffffc48);
        this_01 = vector<duckdb::ScanFilter,_true>::operator[]
                            ((vector<duckdb::ScanFilter,_true> *)
                             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                             (size_type)in_stack_fffffffffffffc48);
        bVar4 = ScanFilter::IsAlwaysTrue(this_01);
        if (!bVar4) {
          pSVar11 = (ScanFilterInfo *)
                    unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                    ::operator*((unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                                 *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          iVar14 = this_01->table_column_index;
          pvVar12 = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)
                               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                               (size_type)in_stack_fffffffffffffc48);
          if (iVar14 == 0xffffffffffffffff) {
            FVar5 = CheckRowIdFilter(in_stack_fffffffffffffcf0,(idx_t)in_stack_fffffffffffffce8,
                                     CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
            if (FVar5 == FILTER_ALWAYS_FALSE) {
              local_b8._0_8_ = (TableFilterSet *)0x0;
            }
            else {
              Vector::SetVectorType
                        ((Vector *)in_stack_fffffffffffffc80,
                         (VectorType)((ulong)in_stack_fffffffffffffc78 >> 0x38));
              plVar13 = FlatVector::GetData<long>((Vector *)0xbe5007);
              for (local_148 = (TableFilterSet *)0x0; local_148 < (ulong)local_b8._0_8_;
                  local_148 = (TableFilterSet *)&(local_148->filters)._M_t._M_impl.field_0x1) {
                in_stack_fffffffffffffd18 = *in_RDI + local_38;
                iVar14 = SelectionVector::get_index(&local_d0,(idx_t)local_148);
                in_stack_fffffffffffffd20 =
                     (Vector *)
                     UnsafeNumericCast<long,unsigned_long,void>(in_stack_fffffffffffffd18 + iVar14);
                iVar14 = SelectionVector::get_index(&local_d0,(idx_t)local_148);
                plVar13[iVar14] = (long)in_stack_fffffffffffffd20;
              }
              if (FVar5 != FILTER_ALWAYS_TRUE) {
                UnifiedVectorFormat::UnifiedVectorFormat
                          ((UnifiedVectorFormat *)in_stack_fffffffffffffc60.__d.__r);
                Vector::ToUnifiedFormat
                          (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                           (UnifiedVectorFormat *)in_stack_fffffffffffffd10);
                in_stack_fffffffffffffc48 = (ScanFilterInfo *)local_b8;
                ColumnSegment::FilterSelection
                          (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                           in_stack_000000d8,in_stack_000000d0,in_stack_00000110);
                UnifiedVectorFormat::~UnifiedVectorFormat
                          ((UnifiedVectorFormat *)
                           CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
              }
            }
          }
          else {
            pCVar15 = GetColumn(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
            local_1a8 = in_stack_00000018;
            local_1b8 = in_stack_00000008;
            uStack_1b0 = in_stack_00000010;
            uVar1 = *(undefined8 *)(local_10 + 8);
            in_stack_fffffffffffffd10 = pCVar15;
            in_stack_fffffffffffffe68 = pCVar15;
            pCVar16 = unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
                      ::operator[]((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
                                    *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                   (size_t)in_stack_fffffffffffffc48);
            in_stack_fffffffffffffc60.__d.__r = (duration)this_01->filter;
            (*pCVar15->_vptr_ColumnData[0xd])(pCVar15,uVar1,pCVar16,pvVar12,&local_d0,local_b8);
            in_stack_fffffffffffffc48 = local_1b8;
            in_stack_fffffffffffffc50 = (undefined4)uStack_1b0;
            in_stack_fffffffffffffc54 = uStack_1b0._4_4_;
            in_stack_fffffffffffffc58 = local_1a8;
            in_stack_fffffffffffffc68 = pSVar11;
          }
        }
      }
      local_1c0 = this_00;
      local_1c8._M_current =
           (ScanFilter *)
           ::std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>::begin
                     ((vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_> *)
                      in_stack_fffffffffffffc48);
      ::std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>::end
                ((vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_> *)
                 in_stack_fffffffffffffc48);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_duckdb::ScanFilter_*,_std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                (__normal_iterator<const_duckdb::ScanFilter_*,_std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>_>
                                 *)in_stack_fffffffffffffc48), bVar4) {
        this_02 = __gnu_cxx::
                  __normal_iterator<const_duckdb::ScanFilter_*,_std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>_>
                  ::operator*(&local_1c8);
        bVar4 = ScanFilter::IsAlwaysTrue(this_02);
        if (!bVar4) {
          vector<duckdb::Vector,_true>::operator[]
                    ((vector<duckdb::Vector,_true> *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (size_type)in_stack_fffffffffffffc48);
          Vector::Slice(in_stack_fffffffffffffe70,(SelectionVector *)in_stack_fffffffffffffe68,
                        in_stack_fffffffffffffe60);
        }
        __gnu_cxx::
        __normal_iterator<const_duckdb::ScanFilter_*,_std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>_>
        ::operator++(&local_1c8);
      }
    }
    if ((TableFilterSet *)local_b8._0_8_ == (TableFilterSet *)0x0) {
      DataChunk::Reset((DataChunk *)in_stack_fffffffffffffcb0);
      local_1e0 = (TableFilter *)0x0;
      while (in_stack_fffffffffffffcf0 = local_1e0,
            pTVar17 = (TableFilter *)
                      ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::
                      size(local_28), in_stack_fffffffffffffcf0 < pTVar17) {
        in_stack_fffffffffffffce8 =
             (RowGroup *)
             vector<duckdb::StorageIndex,_true>::operator[]
                       ((vector<duckdb::StorageIndex,_true> *)
                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                        (size_type)in_stack_fffffffffffffc48);
        bVar4 = StorageIndex::IsRowIdColumn((StorageIndex *)in_stack_fffffffffffffce8);
        if ((!bVar4) &&
           (((local_b8[0x27] & 1) == 0 ||
            (in_stack_fffffffffffffce7 =
                  ScanFilterInfo::ColumnHasFilters
                            (in_stack_fffffffffffffc68,(idx_t)in_stack_fffffffffffffc60.__d.__r),
            !(bool)in_stack_fffffffffffffce7)))) {
          pCVar15 = GetColumn((RowGroup *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                              (StorageIndex *)in_stack_fffffffffffffc48);
          pCVar16 = unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
                    ::operator[]((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
                                  *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                 (size_t)in_stack_fffffffffffffc48);
          (*pCVar15->_vptr_ColumnData[0x10])(pCVar15,pCVar16,0x800);
        }
        local_1e0 = (TableFilter *)((long)&local_1e0->_vptr_TableFilter + 1);
      }
      *(long *)(local_10 + 8) = *(long *)(local_10 + 8) + 1;
      bVar4 = true;
    }
    else {
      for (local_200 = 0;
          sVar10 = ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::size
                             (local_28), local_200 < sVar10; local_200 = local_200 + 1) {
        if (((local_b8[0x27] & 1) == 0) ||
           (bVar4 = ScanFilterInfo::ColumnHasFilters
                              (in_stack_fffffffffffffc68,(idx_t)in_stack_fffffffffffffc60.__d.__r),
           !bVar4)) {
          this_03 = vector<duckdb::StorageIndex,_true>::operator[]
                              ((vector<duckdb::StorageIndex,_true> *)
                               CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                               (size_type)in_stack_fffffffffffffc48);
          bVar4 = StorageIndex::IsRowIdColumn(this_03);
          if (bVar4) {
            in_stack_fffffffffffffcb0 =
                 vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)
                            CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                            (size_type)in_stack_fffffffffffffc48);
            Vector::SetVectorType
                      ((Vector *)in_stack_fffffffffffffc80,
                       (VectorType)((ulong)in_stack_fffffffffffffc78 >> 0x38));
            vector<duckdb::Vector,_true>::operator[]
                      ((vector<duckdb::Vector,_true> *)
                       CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                       (size_type)in_stack_fffffffffffffc48);
            plVar13 = FlatVector::GetData<long>((Vector *)0xbe5613);
            for (local_218 = (TableFilterSet *)0x0; local_218 < (ulong)local_b8._0_8_;
                local_218 = (TableFilterSet *)&(local_218->filters)._M_t._M_impl.field_0x1) {
              lVar18 = *in_RDI + local_38;
              iVar14 = SelectionVector::get_index(&local_d0,(idx_t)local_218);
              lVar18 = UnsafeNumericCast<long,unsigned_long,void>(lVar18 + iVar14);
              plVar13[(long)local_218] = lVar18;
            }
          }
          else {
            in_stack_fffffffffffffc70 =
                 GetColumn((RowGroup *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)
                           ,(StorageIndex *)in_stack_fffffffffffffc48);
            in_stack_fffffffffffffc78 = *(CollectionScanState **)(local_10 + 8);
            in_stack_fffffffffffffc80 =
                 (RowGroup *)
                 unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
                 ::operator[]((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState>,_false>
                               *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                              (size_t)in_stack_fffffffffffffc48);
            pvVar12 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)
                                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                                 (size_type)in_stack_fffffffffffffc48);
            in_stack_fffffffffffffc48 =
                 (ScanFilterInfo *)((ulong)in_stack_fffffffffffffc48 & 0xffffffff00000000);
            (*in_stack_fffffffffffffc70->_vptr_ColumnData[0xf])
                      (in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,in_stack_fffffffffffffc80
                       ,pvVar12,&local_d0,local_b8._0_8_);
          }
        }
      }
      ScanFilterInfo::EndFilter
                (in_stack_fffffffffffffc58,(AdaptiveFilterState)in_stack_fffffffffffffc60.__d.__r);
      local_48 = (TableFilterSet *)local_b8._0_8_;
      bVar4 = false;
    }
    SelectionVector::~SelectionVector((SelectionVector *)0xbe57cf);
    if (!bVar4) goto LAB_00be57f2;
  } while( true );
}

Assistant:

void RowGroup::TemplatedScan(TransactionData transaction, CollectionScanState &state, DataChunk &result) {
	const bool ALLOW_UPDATES = TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_DISALLOW_UPDATES &&
	                           TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED;
	const auto &column_ids = state.GetColumnIds();
	auto &filter_info = state.GetFilterInfo();
	while (true) {
		if (state.vector_index * STANDARD_VECTOR_SIZE >= state.max_row_group_row) {
			// exceeded the amount of rows to scan
			return;
		}
		idx_t current_row = state.vector_index * STANDARD_VECTOR_SIZE;
		auto max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.max_row_group_row - current_row);

		// check the sampling info if we have to sample this chunk
		if (state.GetSamplingInfo().do_system_sample &&
		    state.random.NextRandom() > state.GetSamplingInfo().sample_rate) {
			NextVector(state);
			continue;
		}

		//! first check the zonemap if we have to scan this partition
		if (!CheckZonemapSegments(state)) {
			continue;
		}

		// second, scan the version chunk manager to figure out which tuples to load for this transaction
		idx_t count;
		if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
			count = state.row_group->GetSelVector(transaction, state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else if (TYPE == TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED) {
			count = state.row_group->GetCommittedSelVector(transaction.start_time, transaction.transaction_id,
			                                               state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else {
			count = max_count;
		}
		auto &block_manager = GetBlockManager();
#ifndef DUCKDB_ALTERNATIVE_VERIFY
		// // in regular operation we only prefetch from remote file systems
		// // when alternative verify is set, we always prefetch for testing purposes
		if (block_manager.IsRemote())
#else
		if (!block_manager.InMemory())
#endif
		{
			PrefetchState prefetch_state;
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (!column.IsRowIdColumn()) {
					GetColumn(column).InitializePrefetch(prefetch_state, state.column_scans[i], max_count);
				}
			}
			auto &buffer_manager = block_manager.buffer_manager;
			buffer_manager.Prefetch(prefetch_state.blocks);
		}

		bool has_filters = filter_info.HasFilters();
		if (count == max_count && !has_filters) {
			// scan all vectors completely: full scan without deletions or table filters
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					// scan row id
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].Sequence(UnsafeNumericCast<int64_t>(this->start + current_row), 1, count);
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE != TableScanType::TABLE_SCAN_REGULAR) {
						col_data.ScanCommitted(state.vector_index, state.column_scans[i], result.data[i],
						                       ALLOW_UPDATES);
					} else {
						col_data.Scan(transaction, state.vector_index, state.column_scans[i], result.data[i]);
					}
				}
			}
		} else {
			// partial scan: we have deletions or table filters
			idx_t approved_tuple_count = count;
			SelectionVector sel;
			if (count != max_count) {
				sel.Initialize(state.valid_sel);
			} else {
				sel.Initialize(nullptr);
			}
			//! first, we scan the columns with filters, fetch their data and generate a selection vector.
			//! get runtime statistics
			auto adaptive_filter = filter_info.GetAdaptiveFilter();
			auto filter_state = filter_info.BeginFilter();
			if (has_filters) {
				D_ASSERT(ALLOW_UPDATES);
				auto &filter_list = filter_info.GetFilterList();
				for (idx_t i = 0; i < filter_list.size(); i++) {
					auto filter_idx = adaptive_filter->permutation[i];
					auto &filter = filter_list[filter_idx];
					if (filter.IsAlwaysTrue()) {
						// this filter is always true - skip it
						continue;
					}
					auto &table_filter_state = *filter.filter_state;

					const auto scan_idx = filter.scan_column_index;
					const auto column_idx = filter.table_column_index;

					auto &result_vector = result.data[scan_idx];
					if (column_idx == COLUMN_IDENTIFIER_ROW_ID) {
						// We do another quick statistics scan for row ids here
						const auto rowid_start = this->start + current_row;
						const auto rowid_end = this->start + current_row + max_count;
						const auto prune_result = CheckRowIdFilter(filter.filter, rowid_start, rowid_end);
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
							// We can just break out of the loop here.
							approved_tuple_count = 0;
							continue;
						}

						// Generate row ids
						// Create sequence for row ids
						D_ASSERT(result_vector.GetType().InternalType() == ROW_TYPE);
						result_vector.SetVectorType(VectorType::FLAT_VECTOR);
						auto result_data = FlatVector::GetData<int64_t>(result_vector);
						for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
							result_data[sel.get_index(sel_idx)] =
							    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
						}

						// Was this filter always true? If so, we dont need to apply it
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
							continue;
						}

						// Now apply the filter
						UnifiedVectorFormat vdata;
						result_vector.ToUnifiedFormat(approved_tuple_count, vdata);
						ColumnSegment::FilterSelection(sel, result_vector, vdata, filter.filter, table_filter_state,
						                               approved_tuple_count, approved_tuple_count);

					} else {
						auto &col_data = GetColumn(filter.table_column_index);
						col_data.Filter(transaction, state.vector_index, state.column_scans[scan_idx], result_vector,
						                sel, approved_tuple_count, filter.filter, table_filter_state);
					}
				}
				for (auto &table_filter : filter_list) {
					if (table_filter.IsAlwaysTrue()) {
						continue;
					}
					result.data[table_filter.scan_column_index].Slice(sel, approved_tuple_count);
				}
			}
			if (approved_tuple_count == 0) {
				// all rows were filtered out by the table filters
				D_ASSERT(has_filters);
				result.Reset();
				// skip this vector in all the scans that were not scanned yet
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto &col_idx = column_ids[i];
					if (col_idx.IsRowIdColumn()) {
						continue;
					}
					if (has_filters && filter_info.ColumnHasFilters(i)) {
						continue;
					}
					auto &col_data = GetColumn(col_idx);
					col_data.Skip(state.column_scans[i]);
				}
				state.vector_index++;
				continue;
			}
			//! Now we use the selection vector to fetch data for the other columns.
			for (idx_t i = 0; i < column_ids.size(); i++) {
				if (has_filters && filter_info.ColumnHasFilters(i)) {
					// column has already been scanned as part of the filtering process
					continue;
				}
				auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].SetVectorType(VectorType::FLAT_VECTOR);
					auto result_data = FlatVector::GetData<int64_t>(result.data[i]);
					for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
						result_data[sel_idx] =
						    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
					}
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
						col_data.Select(transaction, state.vector_index, state.column_scans[i], result.data[i], sel,
						                approved_tuple_count);
					} else {
						col_data.SelectCommitted(state.vector_index, state.column_scans[i], result.data[i], sel,
						                         approved_tuple_count, ALLOW_UPDATES);
					}
				}
			}
			filter_info.EndFilter(filter_state);

			D_ASSERT(approved_tuple_count > 0);
			count = approved_tuple_count;
		}
		result.SetCardinality(count);
		state.vector_index++;
		break;
	}
}